

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

bool __thiscall
VulkanHppGenerator::allVectorSizesSupported
          (VulkanHppGenerator *this,
          vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
          *params,map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                  *vectorParams)

{
  bool bVar1;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  *vectorParams_local;
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
  *params_local;
  VulkanHppGenerator *this_local;
  
  bVar1 = std::ranges::__all_of_fn::
          operator()<const_std::map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]Vulkan_Hpp_VulkanHppGenerator_cpp:654:31)>
                    ((__all_of_fn *)&std::ranges::all_of,vectorParams,params);
  return bVar1;
}

Assistant:

bool VulkanHppGenerator::allVectorSizesSupported( std::vector<ParamData> const & params, std::map<size_t, VectorParamData> const & vectorParams ) const
{
  // check if all vector sizes are by value and their type is one of "uint32_t", "VkDeviceSize", or "VkSampleCountFlagBits"
  return std::ranges::all_of( vectorParams,
                              [&params]( auto const & vpi )
                              {
                                return params[vpi.second.lenParam].type.isValue() && ( ( params[vpi.second.lenParam].type.type == "uint32_t" ) ||
                                                                                       ( params[vpi.second.lenParam].type.type == "VkDeviceSize" ) ||
                                                                                       ( params[vpi.second.lenParam].type.type == "VkSampleCountFlagBits" ) );
                              } );
}